

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

double __thiscall Minisat::Solver::progressEstimate(Solver *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long in_RDI;
  __type _Var4;
  int end;
  int beg;
  int i;
  double F;
  double progress;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 local_38;
  undefined4 local_1c;
  undefined8 local_10;
  
  local_10 = 0.0;
  nVars((Solver *)0x13d0f1);
  local_1c = 0;
  while( true ) {
    iVar1 = decisionLevel((Solver *)0x13d121);
    if (iVar1 < local_1c) break;
    if (local_1c == 0) {
      local_38 = 0;
    }
    else {
      piVar3 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x360),local_1c + -1);
      local_38 = *piVar3;
    }
    iVar1 = local_1c;
    iVar2 = decisionLevel((Solver *)0x13d176);
    if (iVar1 == iVar2) {
      iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350));
    }
    else {
      piVar3 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x360),local_1c);
      iVar2 = *piVar3;
    }
    _Var4 = std::pow<double,int>
                      ((double)CONCAT44(iVar1,iVar2),(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20)
                      );
    local_10 = _Var4 * (double)(iVar2 - local_38) + local_10;
    local_1c = local_1c + 1;
  }
  iVar1 = nVars((Solver *)0x13d20e);
  return local_10 / (double)iVar1;
}

Assistant:

double Solver::progressEstimate() const
{
    double progress = 0;
    double F = 1.0 / nVars();

    for (int i = 0; i <= decisionLevel(); i++) {
        int beg = i == 0 ? 0 : trail_lim[i - 1];
        int end = i == decisionLevel() ? trail.size() : trail_lim[i];
        progress += pow(F, i) * (end - beg);
    }

    return progress / nVars();
}